

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_user_resp(Curl_easy *data,int pop3code,pop3state instate)

{
  connectdata *pcVar1;
  char *local_40;
  connectdata *conn;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  if (pop3code == 0x2b) {
    if (pcVar1->passwd == (char *)0x0) {
      local_40 = "";
    }
    else {
      local_40 = pcVar1->passwd;
    }
    conn._4_4_ = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"PASS %s",local_40);
  }
  else {
    Curl_failf(data,"Access denied. %c",(ulong)(uint)pop3code);
    conn._4_4_ = CURLE_LOGIN_DENIED;
  }
  if (conn._4_4_ == CURLE_OK) {
    pop3_state(data,POP3_PASS);
  }
  return conn._4_4_;
}

Assistant:

static CURLcode pop3_state_user_resp(struct Curl_easy *data, int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied. %c", pop3code);
    result = CURLE_LOGIN_DENIED;
  }
  else
    /* Send the PASS command */
    result = Curl_pp_sendf(data, &conn->proto.pop3c.pp, "PASS %s",
                           conn->passwd ? conn->passwd : "");
  if(!result)
    pop3_state(data, POP3_PASS);

  return result;
}